

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char **ppcVar7;
  long lVar8;
  uint uVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  int iVar11;
  byte *pbVar12;
  char *pcVar13;
  byte *pbVar14;
  uint uVar10;
  
  if (end <= ptr) {
    return -4;
  }
  pcVar6 = end;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    break;
  case 2:
    pbVar14 = (byte *)(ptr + 1);
    ppcVar7 = (char **)(end + -(long)pbVar14);
    if ((long)ppcVar7 < 1) {
      return -1;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar14)) {
    case 5:
      if (ppcVar7 == (char **)0x1) {
        return -2;
      }
      iVar4 = (*enc[3].literalScanners[0])
                        (enc,(char *)pbVar14,(char *)&switchD_0045b7b0::switchdataD_005d3944,ppcVar7
                        );
      lVar8 = 2;
      break;
    case 6:
      if (ppcVar7 < (char **)0x3) {
        return -2;
      }
      iVar4 = (*enc[3].literalScanners[1])
                        (enc,(char *)pbVar14,(char *)&switchD_0045b7b0::switchdataD_005d3944,ppcVar7
                        );
      lVar8 = 3;
      break;
    case 7:
      if (ppcVar7 < (char **)0x4) {
        return -2;
      }
      iVar4 = (*enc[3].nameMatchesAscii)
                        (enc,(char *)pbVar14,(char *)&switchD_0045b7b0::switchdataD_005d3944,
                         (char *)ppcVar7);
      lVar8 = 4;
      break;
    default:
      goto switchD_0045b7b0_caseD_8;
    case 0xf:
      iVar4 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
      return iVar4;
    case 0x10:
      pbVar12 = (byte *)(ptr + 2);
      if ((byte *)end == pbVar12 || (long)end - (long)pbVar12 < 0) {
        return -1;
      }
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar12);
      if (cVar2 != '\x14') {
        if (cVar2 != '\x1b') {
          *nextTokPtr = (char *)pbVar12;
          return 0;
        }
        iVar4 = normal_scanComment(enc,ptr + 3,end,nextTokPtr);
        return iVar4;
      }
      pcVar6 = ptr + 3;
      if ((long)end - (long)pcVar6 < 6) {
        return -1;
      }
      pcVar13 = ptr + 9;
      lVar8 = 0;
      do {
        if (pcVar6[lVar8] != (&big2_scanCdataSection_CDATA_LSQB)[lVar8]) {
          pcVar13 = pcVar6 + lVar8;
          iVar4 = 0;
          goto LAB_0045bcd3;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      iVar4 = 8;
LAB_0045bcd3:
      *nextTokPtr = pcVar13;
      return iVar4;
    case 0x11:
      pbVar12 = (byte *)(ptr + 2);
      ppcVar7 = (char **)(end + -(long)pbVar12);
      if ((long)ppcVar7 < 1) {
        return -1;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar12);
      iVar4 = 0;
      iVar11 = 0;
      if (bVar1 < 7) {
        if (bVar1 == 5) {
          if (ppcVar7 == (char **)0x1) {
            return -2;
          }
          iVar5 = (*enc[3].literalScanners[0])
                            (enc,(char *)pbVar12,(char *)&switchD_0045b7b0::switchdataD_005d3944,
                             ppcVar7);
          lVar8 = 2;
        }
        else {
          iVar4 = iVar11;
          if (bVar1 != 6) goto switchD_0045bc48_caseD_8;
          if (ppcVar7 < (char **)0x3) {
            return -2;
          }
          iVar5 = (*enc[3].literalScanners[1])
                            (enc,(char *)pbVar12,(char *)&switchD_0045b7b0::switchdataD_005d3944,
                             ppcVar7);
          lVar8 = 3;
        }
LAB_0045bc00:
        iVar4 = iVar11;
        if (iVar5 == 0) goto switchD_0045bc48_caseD_8;
      }
      else {
        if (bVar1 == 7) {
          if (ppcVar7 < (char **)0x4) {
            return -2;
          }
          iVar5 = (*enc[3].nameMatchesAscii)
                            (enc,(char *)pbVar12,(char *)&switchD_0045b7b0::switchdataD_005d3944,
                             (char *)ppcVar7);
          lVar8 = 4;
          goto LAB_0045bc00;
        }
        lVar8 = 1;
        if ((bVar1 != 0x16) && (bVar1 != 0x18)) goto switchD_0045bc48_caseD_8;
      }
      pbVar12 = pbVar12 + lVar8;
      while( true ) {
        uVar3 = (long)end - (long)pbVar12;
        if ((long)uVar3 < 1) {
          return -1;
        }
        uVar10 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar12);
        uVar9 = uVar10 - 5;
        iVar4 = iVar11;
        if (0x16 < uVar9) break;
        lVar8 = 1;
        pcVar6 = (char *)((long)&switchD_0045bc48::switchdataD_005d3994 +
                         (long)(int)(&switchD_0045bc48::switchdataD_005d3994)[uVar9]);
        switch(uVar10) {
        case 5:
          if (uVar3 == 1) {
            return -2;
          }
          iVar5 = (*enc[3].scanners[0])(enc,(char *)pbVar12,pcVar6,(char **)0x1);
          lVar8 = 2;
          break;
        case 6:
          if (uVar3 < 3) {
            return -2;
          }
          iVar5 = (*enc[3].scanners[1])(enc,(char *)pbVar12,pcVar6,(char **)0x1);
          lVar8 = 3;
          break;
        case 7:
          if (uVar3 < 4) {
            return -2;
          }
          iVar5 = (*enc[3].scanners[2])(enc,(char *)pbVar12,pcVar6,(char **)0x1);
          lVar8 = 4;
          break;
        default:
          goto switchD_0045bc48_caseD_8;
        case 9:
        case 10:
        case 0x15:
          pbVar12 = pbVar12 + 1;
          lVar8 = (long)end - (long)pbVar12;
          while( true ) {
            if (lVar8 < 1) {
              return -1;
            }
            bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar12);
            if ((1 < bVar1 - 9) && (bVar1 != 0x15)) break;
            pbVar12 = pbVar12 + 1;
            lVar8 = lVar8 + -1;
          }
          if (bVar1 != 0xb) goto switchD_0045bc48_caseD_8;
        case 0xb:
          goto switchD_0045bc48_caseD_b;
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          goto switchD_0045bc48_caseD_16;
        }
        if (iVar5 == 0) break;
switchD_0045bc48_caseD_16:
        pbVar12 = pbVar12 + lVar8;
      }
switchD_0045bc48_caseD_8:
      *nextTokPtr = (char *)pbVar12;
      return iVar4;
    case 0x16:
    case 0x18:
      lVar8 = 1;
      goto LAB_0045b927;
    }
    if (iVar4 != 0) {
LAB_0045b927:
      pbVar14 = pbVar14 + lVar8;
      do {
        uVar3 = (long)end - (long)pbVar14;
        if ((long)uVar3 < 1) {
          return -1;
        }
        uVar10 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar14);
        uVar9 = uVar10 - 5;
        if (0x18 < uVar9) break;
        lVar8 = 1;
        pcVar6 = (char *)((long)&switchD_0045b966::switchdataD_005d39f0 +
                         (long)(int)(&switchD_0045b966::switchdataD_005d39f0)[uVar9]);
        switch(uVar10) {
        case 5:
          if (uVar3 == 1) {
            return -2;
          }
          iVar4 = (*enc[3].scanners[0])(enc,(char *)pbVar14,pcVar6,(char **)0x1);
          lVar8 = 2;
          break;
        case 6:
          if (uVar3 < 3) {
            return -2;
          }
          iVar4 = (*enc[3].scanners[1])(enc,(char *)pbVar14,pcVar6,(char **)0x1);
          lVar8 = 3;
          break;
        case 7:
          if (uVar3 < 4) {
            return -2;
          }
          iVar4 = (*enc[3].scanners[2])(enc,(char *)pbVar14,pcVar6,(char **)0x1);
          lVar8 = 4;
          break;
        default:
          goto switchD_0045b7b0_caseD_8;
        case 9:
        case 10:
        case 0x15:
          pbVar14 = pbVar14 + 1;
          ppcVar7 = (char **)(end + -(long)pbVar14);
          if ((long)ppcVar7 < 1) {
            return -1;
          }
          goto LAB_0045bac9;
        case 0xb:
          goto switchD_0045b966_caseD_b;
        case 0x11:
          goto switchD_0045b966_caseD_11;
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          goto switchD_0045b966_caseD_16;
        }
        if (iVar4 == 0) break;
switchD_0045b966_caseD_16:
        pbVar14 = pbVar14 + lVar8;
      } while( true );
    }
switchD_0045b7b0_caseD_8:
    *nextTokPtr = (char *)pbVar14;
    return 0;
  case 3:
    iVar4 = normal_scanRef(enc,ptr + 1,end,nextTokPtr);
    return iVar4;
  case 4:
    pbVar12 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar12 || (long)end - (long)pbVar12 < 0) {
      return -5;
    }
    if (*pbVar12 == 0x5d) {
      ptr = ptr + 2;
      if (end == ptr || (long)end - (long)ptr < 0) {
        return -5;
      }
      if (*ptr == '>') break;
    }
    goto joined_r0x0045b7cb;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar4 = (*enc[3].nameLength)(enc,ptr);
    if (iVar4 == 0) {
      pcVar6 = extraout_RDX_00;
      pbVar12 = (byte *)(ptr + 2);
      goto joined_r0x0045b7cb;
    }
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    pcVar6 = (*enc[3].skipS)(enc,ptr);
    if ((int)pcVar6 == 0) {
      pcVar6 = extraout_RDX;
      pbVar12 = (byte *)(ptr + 3);
      goto joined_r0x0045b7cb;
    }
    break;
  case 7:
    if ((long)(end + -(long)ptr) < 4) {
      return -2;
    }
    iVar4 = (*enc[3].getAtts)(enc,ptr,(int)end,(ATTRIBUTE *)(end + -(long)ptr));
    if (iVar4 == 0) {
      pcVar6 = extraout_RDX_01;
      pbVar12 = (byte *)(ptr + 4);
      goto joined_r0x0045b7cb;
    }
    break;
  case 9:
    pcVar6 = ptr + 1;
    if (end != pcVar6 && -1 < (long)end - (long)pcVar6) {
      if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]) == '\n') {
        pcVar6 = ptr + 2;
      }
      *nextTokPtr = pcVar6;
      return 7;
    }
    return -3;
  case 10:
    *nextTokPtr = ptr + 1;
    return 7;
  default:
    pbVar12 = (byte *)(ptr + 1);
joined_r0x0045b7cb:
    while( true ) {
      pbVar14 = pbVar12;
      uVar3 = (long)end - (long)pbVar14;
      if ((long)uVar3 < 1) {
        *nextTokPtr = (char *)pbVar14;
        return 6;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar14);
      if ((ulong)bVar1 < 0xb) break;
      pbVar12 = pbVar14 + 1;
    }
    switch(bVar1) {
    case 4:
      if (uVar3 == 1) break;
      pbVar12 = pbVar14 + 1;
      if (pbVar14[1] != 0x5d) goto joined_r0x0045b7cb;
      if (uVar3 < 3) break;
      if (pbVar14[2] == 0x3e) goto LAB_0045baa4;
      goto joined_r0x0045b7cb;
    case 5:
      if ((uVar3 != 1) && (iVar4 = (*enc[3].nameLength)(enc,(char *)pbVar14), iVar4 == 0)) {
        pcVar6 = extraout_RDX_03;
        pbVar12 = pbVar14 + 2;
        goto joined_r0x0045b7cb;
      }
      break;
    case 6:
      if ((2 < uVar3) && (pcVar6 = (*enc[3].skipS)(enc,(char *)pbVar14), (int)pcVar6 == 0)) {
        pcVar6 = extraout_RDX_02;
        pbVar12 = pbVar14 + 3;
        goto joined_r0x0045b7cb;
      }
      break;
    case 7:
      if ((3 < uVar3) &&
         (iVar4 = (*enc[3].getAtts)(enc,(char *)pbVar14,(int)pcVar6,
                                    (ATTRIBUTE *)
                                    ((long)&switchD_0045b7f7::switchdataD_005d3ab8 +
                                    (long)(int)(&switchD_0045b7f7::switchdataD_005d3ab8)[bVar1])),
         iVar4 == 0)) {
        pcVar6 = extraout_RDX_04;
        pbVar12 = pbVar14 + 4;
        goto joined_r0x0045b7cb;
      }
    }
    *nextTokPtr = (char *)pbVar14;
    return 6;
  }
  *nextTokPtr = ptr;
  return 0;
LAB_0045baa4:
  pbVar14 = pbVar14 + 2;
  goto switchD_0045b7b0_caseD_8;
switchD_0045bc48_caseD_b:
  pbVar12 = pbVar12 + 1;
  iVar4 = 5;
  goto switchD_0045bc48_caseD_8;
LAB_0045bac9:
  uVar10 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar14);
  uVar9 = uVar10 - 5;
  if (uVar9 < 0x19) {
    pcVar6 = (char *)((long)&switchD_0045bae6::switchdataD_005d3a54 +
                     (long)(int)(&switchD_0045bae6::switchdataD_005d3a54)[uVar9]);
    switch(uVar10) {
    case 5:
      if (ppcVar7 == (char **)0x1) {
        return -2;
      }
      iVar4 = (*enc[3].literalScanners[0])(enc,(char *)pbVar14,pcVar6,ppcVar7);
      lVar8 = 3;
      break;
    case 6:
      if (ppcVar7 < (char **)0x3) {
        return -2;
      }
      iVar4 = (*enc[3].literalScanners[1])(enc,(char *)pbVar14,pcVar6,ppcVar7);
      lVar8 = 4;
      break;
    case 7:
      if (ppcVar7 < (char **)0x4) {
        return -2;
      }
      iVar4 = (*enc[3].nameMatchesAscii)(enc,(char *)pbVar14,pcVar6,(char *)ppcVar7);
      lVar8 = 5;
      break;
    default:
      goto switchD_0045b7b0_caseD_8;
    case 9:
    case 10:
    case 0x15:
      goto switchD_0045bae6_caseD_9;
    case 0xb:
switchD_0045b966_caseD_b:
      *nextTokPtr = (char *)(pbVar14 + 1);
      return 2;
    case 0x11:
switchD_0045b966_caseD_11:
      pbVar12 = pbVar14 + 1;
      if ((byte *)end == pbVar12 || (long)end - (long)pbVar12 < 0) {
        return -1;
      }
      if (*pbVar12 != 0x3e) {
        *nextTokPtr = (char *)pbVar12;
        return 0;
      }
      *nextTokPtr = (char *)(pbVar14 + 2);
      return 4;
    case 0x16:
    case 0x18:
      lVar8 = 2;
      goto LAB_0045bd84;
    }
    if (iVar4 != 0) {
LAB_0045bd84:
      iVar4 = normal_scanAtts(enc,(char *)(pbVar14 + lVar8 + -1),end,nextTokPtr);
      return iVar4;
    }
  }
  goto switchD_0045b7b0_caseD_8;
switchD_0045bae6_caseD_9:
  pbVar14 = pbVar14 + 1;
  ppcVar7 = (char **)((long)ppcVar7 + -1);
  if ((long)ppcVar7 < 1) {
    return -1;
  }
  goto LAB_0045bac9;
}

Assistant:

static int PTRCALL
PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr)
{
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_RSQB:
      if (HAS_CHARS(enc, ptr, end, 2)) {
         if (!CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
           ptr += MINBPC(enc);
           break;
         }
         if (HAS_CHARS(enc, ptr, end, 3)) {
           if (!CHAR_MATCHES(enc, ptr + 2*MINBPC(enc), ASCII_GT)) {
             ptr += MINBPC(enc);
             break;
           }
           *nextTokPtr = ptr + 2*MINBPC(enc);
           return XML_TOK_INVALID;
         }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}